

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::IsSafeToTransferInPrePass(GlobOpt *this,Opnd *src,Value *srcValue)

{
  bool bVar1;
  RegOpnd *pRVar2;
  StackSym *pSVar3;
  int32 local_3c;
  ValueInfo *pVStack_38;
  int32 srcIntConstantValue;
  ValueInfo *srcValueInfo;
  StackSym *srcSym;
  Value *srcValue_local;
  Opnd *src_local;
  GlobOpt *this_local;
  
  srcSym = (StackSym *)srcValue;
  srcValue_local = (Value *)src;
  src_local = (Opnd *)this;
  bVar1 = IR::Opnd::IsRegOpnd(src);
  if (bVar1) {
    pRVar2 = IR::Opnd::AsRegOpnd((Opnd *)srcValue_local);
    srcValueInfo = (ValueInfo *)pRVar2->m_sym;
    bVar1 = StackSym::IsFromByteCodeConstantTable((StackSym *)srcValueInfo);
    if (bVar1) {
      return true;
    }
    pVStack_38 = ::Value::GetValueInfo((Value *)srcSym);
    bVar1 = ValueInfo::TryGetIntConstantValue(pVStack_38,&local_3c,false);
    if (((bVar1) && (bVar1 = Js::TaggedInt::IsOverflow(local_3c), !bVar1)) &&
       (pSVar3 = GetTaggedIntConstantStackSym(this,local_3c), pSVar3 == (StackSym *)srcValueInfo)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::IsSafeToTransferInPrePass(IR::Opnd *src, Value *srcValue)
{
    if (src->IsRegOpnd())
    {
        StackSym *srcSym = src->AsRegOpnd()->m_sym;
        if (srcSym->IsFromByteCodeConstantTable())
        {
            return true;
        }

        ValueInfo *srcValueInfo = srcValue->GetValueInfo();

        int32 srcIntConstantValue;
        if (srcValueInfo->TryGetIntConstantValue(&srcIntConstantValue) && !Js::TaggedInt::IsOverflow(srcIntConstantValue)
            && GetTaggedIntConstantStackSym(srcIntConstantValue) == srcSym)
        {
            return true;
        }
    }

    return false;
}